

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxList.cpp
# Opt level: O1

BoxList * __thiscall amrex::BoxList::removeEmpty(BoxList *this)

{
  pointer pBVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  pointer pBVar5;
  pointer pBVar6;
  long lVar7;
  
  pBVar5 = (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_start;
  pBVar1 = (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar7 = ((long)pBVar1 - (long)pBVar5 >> 2) * 0x6db6db6db6db6db7 >> 2;
  pBVar6 = pBVar5;
  if (0 < lVar7) {
    pBVar6 = pBVar5 + lVar7 * 4;
    lVar7 = lVar7 + 1;
    pBVar5 = pBVar5 + 2;
    do {
      if ((((pBVar5[-2].bigend.vect[0] < pBVar5[-2].smallend.vect[0]) ||
           (pBVar5[-2].bigend.vect[1] < pBVar5[-2].smallend.vect[1])) ||
          (pBVar5[-2].bigend.vect[2] < pBVar5[-2].smallend.vect[2])) || (7 < pBVar5[-2].btype.itype)
         ) {
        pBVar5 = pBVar5 + -2;
        goto LAB_0047be1a;
      }
      if (((pBVar5[-1].bigend.vect[0] < pBVar5[-1].smallend.vect[0]) ||
          (pBVar5[-1].bigend.vect[1] < pBVar5[-1].smallend.vect[1])) ||
         ((pBVar5[-1].bigend.vect[2] < pBVar5[-1].smallend.vect[2] || (7 < pBVar5[-1].btype.itype)))
         ) {
        pBVar5 = pBVar5 + -1;
        goto LAB_0047be1a;
      }
      if ((((pBVar5->bigend).vect[0] < (pBVar5->smallend).vect[0]) ||
          ((pBVar5->bigend).vect[1] < (pBVar5->smallend).vect[1])) ||
         (((pBVar5->bigend).vect[2] < (pBVar5->smallend).vect[2] || (7 < (pBVar5->btype).itype))))
      goto LAB_0047be1a;
      if ((((pBVar5[1].bigend.vect[0] < pBVar5[1].smallend.vect[0]) ||
           (pBVar5[1].bigend.vect[1] < pBVar5[1].smallend.vect[1])) ||
          (pBVar5[1].bigend.vect[2] < pBVar5[1].smallend.vect[2])) || (7 < pBVar5[1].btype.itype)) {
        pBVar5 = pBVar5 + 1;
        goto LAB_0047be1a;
      }
      lVar7 = lVar7 + -1;
      pBVar5 = pBVar5 + 4;
    } while (1 < lVar7);
  }
  lVar7 = ((long)pBVar1 - (long)pBVar6 >> 2) * 0x6db6db6db6db6db7;
  if (lVar7 != 1) {
    if (lVar7 != 2) {
      pBVar5 = pBVar1;
      if (((lVar7 != 3) || (pBVar5 = pBVar6, (pBVar6->bigend).vect[0] < (pBVar6->smallend).vect[0]))
         || (((pBVar6->bigend).vect[1] < (pBVar6->smallend).vect[1] ||
             (((pBVar6->bigend).vect[2] < (pBVar6->smallend).vect[2] || (7 < (pBVar6->btype).itype))
             )))) goto LAB_0047be1a;
      pBVar6 = pBVar6 + 1;
    }
    pBVar5 = pBVar6;
    if (((((pBVar6->bigend).vect[0] < (pBVar6->smallend).vect[0]) ||
         ((pBVar6->bigend).vect[1] < (pBVar6->smallend).vect[1])) ||
        ((pBVar6->bigend).vect[2] < (pBVar6->smallend).vect[2])) || (7 < (pBVar6->btype).itype))
    goto LAB_0047be1a;
    pBVar6 = pBVar6 + 1;
  }
  pBVar5 = pBVar6;
  if ((((pBVar6->smallend).vect[0] <= (pBVar6->bigend).vect[0]) &&
      ((pBVar6->smallend).vect[1] <= (pBVar6->bigend).vect[1])) &&
     (((pBVar6->smallend).vect[2] <= (pBVar6->bigend).vect[2] && ((pBVar6->btype).itype < 8)))) {
    pBVar5 = pBVar1;
  }
LAB_0047be1a:
  pBVar6 = pBVar5 + 1;
  if (pBVar6 != pBVar1 && pBVar5 != pBVar1) {
    do {
      if ((((pBVar6->smallend).vect[0] <= (pBVar6->bigend).vect[0]) &&
          ((pBVar6->smallend).vect[1] <= (pBVar6->bigend).vect[1])) &&
         (((pBVar6->smallend).vect[2] <= (pBVar6->bigend).vect[2] && ((pBVar6->btype).itype < 8))))
      {
        uVar2 = *(undefined8 *)(pBVar6->smallend).vect;
        uVar3 = *(undefined8 *)((pBVar6->smallend).vect + 2);
        uVar4 = *(undefined8 *)((pBVar6->bigend).vect + 2);
        *(undefined8 *)(pBVar5->bigend).vect = *(undefined8 *)(pBVar6->bigend).vect;
        *(undefined8 *)((pBVar5->bigend).vect + 2) = uVar4;
        *(undefined8 *)(pBVar5->smallend).vect = uVar2;
        *(undefined8 *)((pBVar5->smallend).vect + 2) = uVar3;
        pBVar5 = pBVar5 + 1;
      }
      pBVar6 = pBVar6 + 1;
    } while (pBVar6 != pBVar1);
  }
  pBVar1 = (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((pBVar5 != pBVar1) &&
     (pBVar6 = (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_finish,
     pBVar5 = (pointer)((long)pBVar5 + ((long)pBVar6 - (long)pBVar1)), pBVar6 != pBVar5)) {
    (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_finish = pBVar5;
  }
  return this;
}

Assistant:

BoxList&
BoxList::removeEmpty()
{
    m_lbox.erase(std::remove_if(m_lbox.begin(), m_lbox.end(),
                                [](const Box& x) { return x.isEmpty(); }),
                 m_lbox.end());
    return *this;
}